

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::ArchiveShellCommand::configureInputs
          (ArchiveShellCommand *this,ConfigureContext *ctx,
          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *value
          )

{
  bool bVar1;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *this_00;
  Twine local_88;
  StringRef local_70;
  string local_60;
  reference local_40;
  BuildNode **input;
  const_iterator __end2;
  const_iterator __begin2;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *__range2;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *value_local;
  ConfigureContext *ctx_local;
  ArchiveShellCommand *this_local;
  
  llbuild::buildsystem::ExternalCommand::configureInputs(&this->super_ExternalCommand,ctx,value);
  this_00 = llbuild::buildsystem::Command::getInputs((Command *)this);
  __end2 = std::
           vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
           ::begin(this_00);
  input = (BuildNode **)
          std::
          vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
          ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                                     *)&input), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
               ::operator*(&__end2);
    bVar1 = llbuild::buildsystem::BuildNode::isVirtual(*local_40);
    if (!bVar1) {
      local_70 = llbuild::buildsystem::Node::getName(&(*local_40)->super_Node);
      llvm::StringRef::operator_cast_to_string(&local_60,&local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->archiveInputs,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    __gnu_cxx::
    __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->archiveInputs);
  if (bVar1) {
    llvm::Twine::Twine(&local_88,"missing expected input");
    llbuild::buildsystem::ConfigureContext::error(ctx,&local_88);
  }
  return;
}

Assistant:

virtual void configureInputs(const ConfigureContext& ctx,
                                const std::vector<Node*>& value) override {
    ExternalCommand::configureInputs(ctx, value);

    for (const auto& input: getInputs()) {
      if (!input->isVirtual()) {
        archiveInputs.push_back(input->getName());
      }
    }
    if (archiveInputs.empty()) {
      ctx.error("missing expected input");
    }
  }